

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O0

void opengv::relative_pose::modules::fivept_kneip::sPolynomial52
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  Scalar *pSVar3;
  Scalar row;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *this;
  Index in_stack_fffffffffffffde8;
  DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *in_stack_fffffffffffffdf0;
  
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,0x105fc56);
  row = -*pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (in_stack_fffffffffffffdf0,(Index)row,0x105fc8d);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1> *)(row / *pSVar3);
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fcb3);
  *pSVar3 = (Scalar)this;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fcd4);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fd0c);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fd31);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fd52);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fd8a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fdb1);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fdd2);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fe0a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fe31);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fe52);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fe8a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105feb1);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fed2);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105ff0a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105ff31);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105ff52);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105ff73);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105ff9a);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105ffbb);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x105fff3);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106001a);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106003b);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060076);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10600a3);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10600c7);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060102);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106012f);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060153);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106018e);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10601bb);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10601df);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106021a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060247);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106026b);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10602a6);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10602d3);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10602f7);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060332);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106035f);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060383);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10603be);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10603eb);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106040f);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106044a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060477);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106049b);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10604d6);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060503);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060527);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060562);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106058f);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10605b3);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10605ee);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106061b);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106063f);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106067a);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10606a7);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10606cb);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060706);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060733);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060757);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060792);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10607bf);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10607e3);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060807);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060834);
  *pSVar3 = dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060858);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060893);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10608c0);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10608e4);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106091f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x106094c);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060970);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10609ab);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10609d8);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x10609fc);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060a37);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060a64);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060a88);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060ac3);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060af0);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060b14);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060b4f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060b7c);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060ba0);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060bdb);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060c08);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060c2c);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060c67);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060c94);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060cb8);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060cf3);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060d20);
  *pSVar3 = -dVar1 / dVar2;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060d44);
  dVar1 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060d7f);
  dVar2 = *pSVar3;
  pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>,_1>::operator()
                     (this,(Index)row,0x1060dac);
  *pSVar3 = -dVar1 / dVar2;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial52( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(52,51) = -groebnerMatrix(33,157)/(groebnerMatrix(33,156));
  groebnerMatrix(52,52) = -groebnerMatrix(33,158)/(groebnerMatrix(33,156));
  groebnerMatrix(52,53) = -groebnerMatrix(33,159)/(groebnerMatrix(33,156));
  groebnerMatrix(52,54) = -groebnerMatrix(33,160)/(groebnerMatrix(33,156));
  groebnerMatrix(52,55) = -groebnerMatrix(33,161)/(groebnerMatrix(33,156));
  groebnerMatrix(52,56) = -groebnerMatrix(33,162)/(groebnerMatrix(33,156));
  groebnerMatrix(52,74) = groebnerMatrix(21,173)/(groebnerMatrix(21,167));
  groebnerMatrix(52,82) = -groebnerMatrix(33,170)/(groebnerMatrix(33,156));
  groebnerMatrix(52,83) = -groebnerMatrix(33,171)/(groebnerMatrix(33,156));
  groebnerMatrix(52,85) = -groebnerMatrix(33,173)/(groebnerMatrix(33,156));
  groebnerMatrix(52,86) = -groebnerMatrix(33,174)/(groebnerMatrix(33,156));
  groebnerMatrix(52,88) = -groebnerMatrix(33,176)/(groebnerMatrix(33,156));
  groebnerMatrix(52,95) = -groebnerMatrix(33,177)/(groebnerMatrix(33,156));
  groebnerMatrix(52,118) = -groebnerMatrix(33,178)/(groebnerMatrix(33,156));
  groebnerMatrix(52,119) = -groebnerMatrix(33,179)/(groebnerMatrix(33,156));
  groebnerMatrix(52,120) = -groebnerMatrix(33,180)/(groebnerMatrix(33,156));
  groebnerMatrix(52,121) = -groebnerMatrix(33,181)/(groebnerMatrix(33,156));
  groebnerMatrix(52,122) = -groebnerMatrix(33,182)/(groebnerMatrix(33,156));
  groebnerMatrix(52,123) = -groebnerMatrix(33,183)/(groebnerMatrix(33,156));
  groebnerMatrix(52,124) = -groebnerMatrix(33,184)/(groebnerMatrix(33,156));
  groebnerMatrix(52,131) = -groebnerMatrix(33,185)/(groebnerMatrix(33,156));
  groebnerMatrix(52,139) = -groebnerMatrix(33,186)/(groebnerMatrix(33,156));
  groebnerMatrix(52,154) = groebnerMatrix(21,189)/(groebnerMatrix(21,167));
  groebnerMatrix(52,163) = -groebnerMatrix(33,187)/(groebnerMatrix(33,156));
  groebnerMatrix(52,164) = -groebnerMatrix(33,188)/(groebnerMatrix(33,156));
  groebnerMatrix(52,165) = -groebnerMatrix(33,189)/(groebnerMatrix(33,156));
  groebnerMatrix(52,166) = -groebnerMatrix(33,190)/(groebnerMatrix(33,156));
  groebnerMatrix(52,167) = -groebnerMatrix(33,191)/(groebnerMatrix(33,156));
  groebnerMatrix(52,168) = -groebnerMatrix(33,192)/(groebnerMatrix(33,156));
  groebnerMatrix(52,169) = -groebnerMatrix(33,193)/(groebnerMatrix(33,156));
  groebnerMatrix(52,176) = -groebnerMatrix(33,194)/(groebnerMatrix(33,156));
  groebnerMatrix(52,184) = -groebnerMatrix(33,195)/(groebnerMatrix(33,156));
  groebnerMatrix(52,193) = -groebnerMatrix(33,196)/(groebnerMatrix(33,156));
}